

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

string * EncodeExtPubKey_abi_cxx11_(CExtPubKey *key)

{
  long lVar1;
  Span<const_unsigned_char> *in_RSI;
  CExtPubKey *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> in_stack_00000020;
  size_t size;
  string *ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  Base58Type in_stack_ffffffffffffff84;
  CChainParams *in_stack_ffffffffffffff88;
  CExtPubKey *this;
  CExtPubKey *__x;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  __x = in_RDI;
  Params();
  CChainParams::Base58Prefix(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffd0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_ffffffffffffff78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(size_type)in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(in_stack_ffffffffffffff78);
  CExtPubKey::Encode(this,in_RDI->version);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_RSI,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  EncodeBase58Check_abi_cxx11_(in_stack_00000020);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (string *)this;
}

Assistant:

std::string EncodeExtPubKey(const CExtPubKey& key)
{
    std::vector<unsigned char> data = Params().Base58Prefix(CChainParams::EXT_PUBLIC_KEY);
    size_t size = data.size();
    data.resize(size + BIP32_EXTKEY_SIZE);
    key.Encode(data.data() + size);
    std::string ret = EncodeBase58Check(data);
    return ret;
}